

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

numeric_type __thiscall
viennamath::rt_variable<viennamath::rt_expression_interface<double>_>::eval
          (rt_variable<viennamath::rt_expression_interface<double>_> *this,
          vector<double,_std::allocator<double>_> *v)

{
  ulong uVar1;
  id_type id;
  size_type sVar2;
  variable_index_out_of_bounds_exception *this_00;
  numeric_type nVar3;
  vector<double,_std::allocator<double>_> *v_local;
  rt_variable<viennamath::rt_expression_interface<double>_> *this_local;
  
  uVar1 = this->id_;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(v);
  if (sVar2 <= uVar1) {
    this_00 = (variable_index_out_of_bounds_exception *)__cxa_allocate_exception(0x18);
    id = this->id_;
    sVar2 = std::vector<double,_std::allocator<double>_>::size(v);
    variable_index_out_of_bounds_exception::variable_index_out_of_bounds_exception(this_00,id,sVar2)
    ;
    __cxa_throw(this_00,&variable_index_out_of_bounds_exception::typeinfo,
                variable_index_out_of_bounds_exception::~variable_index_out_of_bounds_exception);
  }
  nVar3 = rt_variable<viennamath::rt_expression_interface<double>>::operator()
                    ((rt_variable<viennamath::rt_expression_interface<double>> *)this,v);
  return nVar3;
}

Assistant:

numeric_type eval(std::vector<double> const & v) const
      {
        if (id_ >= v.size())
          throw variable_index_out_of_bounds_exception(static_cast<long>(id_), static_cast<long>(v.size()));

        return (*this)(v);
      }